

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cpp
# Opt level: O1

char * __thiscall timing::elapsed_time_readable(timing *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  (this->current).__d.__r = lVar3;
  iVar1 = (int)((double)(lVar3 - (this->start).__d.__r) / 1000000000.0);
  iVar2 = iVar1 % 0xe10;
  sprintf(this->runtime,"%ih:%im:%is",(ulong)(uint)(iVar1 / 0xe10),(ulong)(uint)(iVar2 / 0x3c),
          (ulong)(uint)(iVar2 % 0x3c));
  return this->runtime;
}

Assistant:

char *timing::elapsed_time_readable(){

    double diff_time=elapsed_time_seconds();
    int delta_time=int(diff_time);

    int runtime_hours=delta_time/3600;
    int runtime_minutes=(delta_time % 3600)/60;
    int runtime_seconds=(delta_time % 3600)%60;
    sprintf(runtime,"%ih:%im:%is",runtime_hours,runtime_minutes,runtime_seconds);

    return runtime;

}